

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXExportProperty::DumpAscii(FBXExportProperty *this,ostream *s,int indent)

{
  bool bVar1;
  double *pdVar2;
  reference pvVar3;
  size_type sVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  string local_260 [32];
  ostringstream local_240 [8];
  ostringstream err;
  int local_c4;
  ulong uStack_c0;
  int i_15;
  size_t i_14;
  int i_13;
  int i_12;
  size_t i_11;
  int i_10;
  int i_9;
  size_t i_8;
  int i_7;
  int i_6;
  size_t i_5;
  int i_4;
  char c_2;
  size_t i_3;
  ulong uStack_70;
  char c_1;
  size_t i_2;
  ulong uStack_50;
  char c;
  size_t i_1;
  size_t i;
  size_t count;
  size_t swap;
  size_t N;
  uint8_t *d;
  int indent_local;
  ostream *s_local;
  FBXExportProperty *this_local;
  
  pdVar2 = (double *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
  count = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
  i = 0;
  switch(this->type) {
  case 'C':
    if (*(char *)pdVar2 == '\0') {
      std::operator<<(s,'F');
    }
    else {
      std::operator<<(s,'T');
    }
    break;
  case 'D':
    std::ostream::operator<<(s,*pdVar2);
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_240);
    std::operator<<((ostream *)local_240,"Tried to dump property with invalid type \'");
    poVar5 = std::operator<<((ostream *)local_240,this->type);
    std::operator<<(poVar5,"\'!");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar6,local_260);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 'F':
    std::ostream::operator<<(s,*(float *)pdVar2);
    break;
  case 'I':
    std::ostream::operator<<(s,(int)*(float *)pdVar2);
    break;
  case 'L':
    std::ostream::operator<<(s,(long)*pdVar2);
    break;
  case 'S':
    for (i_1 = 0; sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                    (&this->data), i_1 < sVar4; i_1 = i_1 + 1) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->data,i_1);
      if (*pvVar3 == '\0') {
        count = i_1;
        break;
      }
    }
  case 'R':
    std::operator<<(s,'\"');
    for (uStack_50 = 0;
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data),
        uStack_50 < sVar4; uStack_50 = uStack_50 + 1) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->data,uStack_50);
      if (*pvVar3 == '\"') {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"can\'t handle quotes in property string");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    for (uStack_70 = count + 2;
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data),
        uStack_70 < sVar4; uStack_70 = uStack_70 + 1) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->data,uStack_70);
      std::operator<<(s,*pvVar3);
    }
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    if (count != sVar4) {
      std::operator<<(s,"::");
    }
    for (_i_4 = 0; _i_4 < count; _i_4 = _i_4 + 1) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->data,_i_4);
      std::operator<<(s,*pvVar3);
    }
    std::operator<<(s,'\"');
    break;
  case 'Y':
    std::ostream::operator<<(s,*(short *)pdVar2);
    break;
  case 'd':
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    poVar5 = std::operator<<(s,'*');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar4 >> 3);
    std::operator<<(poVar5," {\n");
    for (i_14._0_4_ = 0; (int)i_14 < indent + 1; i_14._0_4_ = (int)i_14 + 1) {
      std::operator<<(s,'\t');
    }
    std::operator<<(s,"a: ");
    std::ios_base::precision((ios_base *)(s + *(long *)(*(long *)s + -0x18)),0xf);
    for (uStack_c0 = 0; uStack_c0 < sVar4 >> 3; uStack_c0 = uStack_c0 + 1) {
      if (uStack_c0 != 0) {
        std::operator<<(s,',');
      }
      bVar1 = 0x78 < i;
      i = i + 1;
      if (bVar1) {
        std::operator<<(s,'\n');
        i = 0;
      }
      std::ostream::operator<<(s,pdVar2[uStack_c0]);
    }
    std::operator<<(s,'\n');
    for (local_c4 = 0; local_c4 < indent; local_c4 = local_c4 + 1) {
      std::operator<<(s,'\t');
    }
    std::operator<<(s,"} ");
    break;
  case 'f':
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    poVar5 = std::operator<<(s,'*');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar4 >> 2);
    std::operator<<(poVar5," {\n");
    for (i_11._0_4_ = 0; (int)i_11 < indent + 1; i_11._0_4_ = (int)i_11 + 1) {
      std::operator<<(s,'\t');
    }
    std::operator<<(s,"a: ");
    for (_i_13 = 0; _i_13 < sVar4 >> 2; _i_13 = _i_13 + 1) {
      if (_i_13 != 0) {
        std::operator<<(s,',');
      }
      bVar1 = 0x78 < i;
      i = i + 1;
      if (bVar1) {
        std::operator<<(s,'\n');
        i = 0;
      }
      std::ostream::operator<<(s,*(float *)((long)pdVar2 + _i_13 * 4));
    }
    std::operator<<(s,'\n');
    for (i_14._4_4_ = 0; i_14._4_4_ < indent; i_14._4_4_ = i_14._4_4_ + 1) {
      std::operator<<(s,'\t');
    }
    std::operator<<(s,"} ");
    break;
  case 'i':
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    poVar5 = std::operator<<(s,'*');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar4 >> 2);
    std::operator<<(poVar5," {\n");
    for (i_5._0_4_ = 0; (int)i_5 < indent + 1; i_5._0_4_ = (int)i_5 + 1) {
      std::operator<<(s,'\t');
    }
    std::operator<<(s,"a: ");
    for (_i_7 = 0; _i_7 < sVar4 >> 2; _i_7 = _i_7 + 1) {
      if (_i_7 != 0) {
        std::operator<<(s,',');
      }
      bVar1 = 0x78 < i;
      i = i + 1;
      if (bVar1) {
        std::operator<<(s,'\n');
        i = 0;
      }
      std::ostream::operator<<(s,(int)*(float *)((long)pdVar2 + _i_7 * 4));
    }
    std::operator<<(s,'\n');
    for (i_8._4_4_ = 0; i_8._4_4_ < indent; i_8._4_4_ = i_8._4_4_ + 1) {
      std::operator<<(s,'\t');
    }
    std::operator<<(s,"} ");
    break;
  case 'l':
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    poVar5 = std::operator<<(s,'*');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar4 >> 3);
    std::operator<<(poVar5," {\n");
    for (i_8._0_4_ = 0; (int)i_8 < indent + 1; i_8._0_4_ = (int)i_8 + 1) {
      std::operator<<(s,'\t');
    }
    std::operator<<(s,"a: ");
    for (_i_10 = 0; _i_10 < sVar4 >> 3; _i_10 = _i_10 + 1) {
      if (_i_10 != 0) {
        std::operator<<(s,',');
      }
      bVar1 = 0x78 < i;
      i = i + 1;
      if (bVar1) {
        std::operator<<(s,'\n');
        i = 0;
      }
      std::ostream::operator<<(s,(long)pdVar2[_i_10]);
    }
    std::operator<<(s,'\n');
    for (i_11._4_4_ = 0; i_11._4_4_ < indent; i_11._4_4_ = i_11._4_4_ + 1) {
      std::operator<<(s,'\t');
    }
    std::operator<<(s,"} ");
  }
  return;
}

Assistant:

void FBXExportProperty::DumpAscii(std::ostream& s, int indent) {
    // no writing type... or anything. just shove it into the stream.
    uint8_t* d = data.data();
    size_t N;
    size_t swap = data.size();
    size_t count = 0;
    switch (type) {
    case 'C':
        if (*(reinterpret_cast<uint8_t*>(d))) { s << 'T'; }
        else { s << 'F'; }
        return;
    case 'Y': s << *(reinterpret_cast<int16_t*>(d)); return;
    case 'I': s << *(reinterpret_cast<int32_t*>(d)); return;
    case 'F': s << *(reinterpret_cast<float*>(d)); return;
    case 'D': s << *(reinterpret_cast<double*>(d)); return;
    case 'L': s << *(reinterpret_cast<int64_t*>(d)); return;
    case 'S':
        // first search to see if it has "\x00\x01" in it -
        // which separates fields which are reversed in the ascii version.
        // yeah.
        // FBX, yeah.
        for (size_t i = 0; i < data.size(); ++i) {
            if (data[i] == '\0') {
                swap = i;
                break;
            }
        }
    case 'R':
        s << '"';
        // we might as well check this now,
        // probably it will never happen
        for (size_t i = 0; i < data.size(); ++i) {
            char c = data[i];
            if (c == '"') {
                throw runtime_error("can't handle quotes in property string");
            }
        }
        // first write the SWAPPED member (if any)
        for (size_t i = swap + 2; i < data.size(); ++i) {
            char c = data[i];
            s << c;
        }
        // then a separator
        if (swap != data.size()) {
            s << "::";
        }
        // then the initial member
        for (size_t i = 0; i < swap; ++i) {
            char c = data[i];
            s << c;
        }
        s << '"';
        return;
    case 'i':
        N = data.size() / 4; // number of elements
        s << '*' << N << " {\n";
        for (int i = 0; i < indent + 1; ++i) { s << '\t'; }
        s << "a: ";
        for (size_t i = 0; i < N; ++i) {
            if (i > 0) { s << ','; }
            if (count++ > 120) { s << '\n'; count = 0; }
            s << (reinterpret_cast<int32_t*>(d))[i];
        }
        s << '\n';
        for (int i = 0; i < indent; ++i) { s << '\t'; }
        s << "} ";
        return;
    case 'l':
        N = data.size() / 8;
        s << '*' << N << " {\n";
        for (int i = 0; i < indent + 1; ++i) { s << '\t'; }
        s << "a: ";
        for (size_t i = 0; i < N; ++i) {
            if (i > 0) { s << ','; }
            if (count++ > 120) { s << '\n'; count = 0; }
            s << (reinterpret_cast<int64_t*>(d))[i];
        }
        s << '\n';
        for (int i = 0; i < indent; ++i) { s << '\t'; }
        s << "} ";
        return;
    case 'f':
        N = data.size() / 4;
        s << '*' << N << " {\n";
        for (int i = 0; i < indent + 1; ++i) { s << '\t'; }
        s << "a: ";
        for (size_t i = 0; i < N; ++i) {
            if (i > 0) { s << ','; }
            if (count++ > 120) { s << '\n'; count = 0; }
            s << (reinterpret_cast<float*>(d))[i];
        }
        s << '\n';
        for (int i = 0; i < indent; ++i) { s << '\t'; }
        s << "} ";
        return;
    case 'd':
        N = data.size() / 8;
        s << '*' << N << " {\n";
        for (int i = 0; i < indent + 1; ++i) { s << '\t'; }
        s << "a: ";
        // set precision to something that can handle doubles
        s.precision(15);
        for (size_t i = 0; i < N; ++i) {
            if (i > 0) { s << ','; }
            if (count++ > 120) { s << '\n'; count = 0; }
            s << (reinterpret_cast<double*>(d))[i];
        }
        s << '\n';
        for (int i = 0; i < indent; ++i) { s << '\t'; }
        s << "} ";
        return;
    default:
        std::ostringstream err;
        err << "Tried to dump property with invalid type '";
        err << type << "'!";
        throw runtime_error(err.str());
    }
}